

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPundef(TPpContext *this,TPpToken *ppToken)

{
  int atom;
  MacroSymbol *pMVar1;
  MacroSymbol *macro;
  int token;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  this_local._4_4_ = scanToken(this,ppToken);
  if (this_local._4_4_ == 0xa2) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x37])
              (this->parseContext,ppToken,ppToken->name,"#undef");
    atom = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    pMVar1 = lookupMacroDef(this,atom);
    if (pMVar1 != (MacroSymbol *)0x0) {
      pMVar1->field_0x48 = pMVar1->field_0x48 & 0xfb | 4;
    }
    this_local._4_4_ = scanToken(this,ppToken);
    if (this_local._4_4_ != 10) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"can only be followed by a single macro name","#undef",
                 "");
    }
  }
  else {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"must be followed by macro name","#undef","");
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::CPPundef(TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (token != PpAtomIdentifier) {
        parseContext.ppError(ppToken->loc, "must be followed by macro name", "#undef", "");

        return token;
    }

    parseContext.reservedPpErrorCheck(ppToken->loc, ppToken->name, "#undef");

    MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
    if (macro != nullptr)
        macro->undef = 1;
    token = scanToken(ppToken);
    if (token != '\n')
        parseContext.ppError(ppToken->loc, "can only be followed by a single macro name", "#undef", "");

    return token;
}